

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O2

int main(void)

{
  node *newest_node;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  uint depth;
  int iVar4;
  float local_2b4;
  value_type local_2b0;
  min_heap to_expand;
  Pyraminx myPyraminx;
  ofstream logfile;
  
  std::ofstream::ofstream(&logfile);
  std::ofstream::open((char *)&logfile,0x109030);
  std::operator<<((ostream *)&logfile,"k, nodes expanded\n");
  std::ofstream::close();
  depth = 3;
  do {
    if (depth == 0x15) {
      std::ofstream::~ofstream(&logfile);
      return 0;
    }
    local_2b4 = 0.0;
    for (iVar4 = 0; iVar4 != 5; iVar4 = iVar4 + 1) {
      Pyraminx::Pyraminx(&myPyraminx);
      Pyraminx::scramble(&myPyraminx,depth);
      printf("Solving puzzle randomized with %i moves...\n",(ulong)depth);
      Pyraminx::print(&myPyraminx);
      iVar2 = Pyraminx::get_heuristic(&myPyraminx);
      to_expand.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      to_expand.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      to_expand.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2b0 = (value_type)operator_new(0x18);
      local_2b0->cost = iVar2;
      local_2b0->parent = (node *)0x0;
      std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::push
                (&to_expand,&local_2b0);
      while (to_expand.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
             super__Vector_impl_data._M_start !=
             to_expand.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        newest_node = *to_expand.c.super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
        std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::pop
                  (&to_expand);
        iVar2 = apply_moves(newest_node,&myPyraminx);
        bVar1 = Pyraminx::is_solved(&myPyraminx);
        if (bVar1) {
          printf("Solved! Solution is: ");
          print_move_list(newest_node);
          free_nodes(&to_expand);
          break;
        }
        enqueue_children(&to_expand,newest_node,&myPyraminx,iVar2);
        local_2b4 = local_2b4 + 1.0;
        undo_moves(newest_node,&myPyraminx);
      }
      std::_Vector_base<node_*,_std::allocator<node_*>_>::~_Vector_base
                ((_Vector_base<node_*,_std::allocator<node_*>_> *)&to_expand);
      Pyraminx::~Pyraminx(&myPyraminx);
    }
    std::ofstream::open((char *)&logfile,0x109030);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&logfile,depth);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_2b4 / 5.0);
    std::operator<<(poVar3,"\n");
    std::ofstream::close();
    depth = depth + 1;
  } while( true );
}

Assistant:

int main(){
    // Open file to write out number of expanded nodes:
    std::ofstream logfile;
    logfile.open ("log.txt", std::ios::out | std::ios::app );
    logfile << "k, nodes expanded\n";
    logfile.close();

    int k_start = 3;
    int k_stop = 20;
    int num_instances = 5;
    // For each k, solve 5 puzzles randomized with k moves
    for(int k = k_start; k <= k_stop; k++){
        float count = 0;
        for(int i = 0; i < num_instances; i++){
            Pyraminx myPyraminx;
            myPyraminx.scramble(k);
            printf("Solving puzzle randomized with %i moves...\n", k);
            myPyraminx.print();

            // Create and enqueue root node
            int g = 0;
            int h = myPyraminx.get_heuristic();
            int f = g + h;
    
            min_heap to_expand;
            
            to_expand.push(new node(f));

            // Explore tree
            bool finished;
            while(!to_expand.empty()){
                node* current = to_expand.top();
                to_expand.pop();
                g = apply_moves(current, myPyraminx);
                finished = myPyraminx.is_solved();
                if(finished){
                    printf("Solved! Solution is: ");
                    print_move_list(*current);
                    free_nodes(to_expand);
                    break;
                }
                else{
                    count++;
                    enqueue_children(to_expand, current, myPyraminx, g);
                    undo_moves(current, myPyraminx);
                }
            }
        }// i for loop (5 instances)
        // We reopen and close the file each time because we don't want to lose
        // the data if termination is early
        logfile.open ("log.txt", std::ios::out | std::ios::app );
        float average = count / num_instances;
        logfile << k << ", " << average << "\n";
        logfile.close();
    }// k for loop (k from 3 to 20) 
}